

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLBigDecimal.cpp
# Opt level: O0

void xercesc_4_0::XMLBigDecimal::parseDecimal
               (XMLCh *toParse,XMLCh *retBuffer,int *sign,int *totalDigits,int *fractDigits,
               MemoryManager *manager)

{
  bool bVar1;
  NumberFormatException *pNVar2;
  XMLSize_t XVar3;
  XMLCh *pXStack_60;
  bool dotSignFound;
  XMLCh *retPtr;
  XMLCh *endPtr;
  XMLCh *local_40;
  XMLCh *startPtr;
  MemoryManager *manager_local;
  int *fractDigits_local;
  int *totalDigits_local;
  int *sign_local;
  XMLCh *retBuffer_local;
  XMLCh *toParse_local;
  
  *retBuffer = L'\0';
  *totalDigits = 0;
  *fractDigits = 0;
  local_40 = toParse;
  while (bVar1 = XMLChar1_0::isWhitespace(*local_40), bVar1) {
    local_40 = local_40 + 1;
  }
  if (*local_40 != L'\0') {
    XVar3 = XMLString::stringLen(toParse);
    retPtr = toParse + XVar3;
    while (bVar1 = XMLChar1_0::isWhitespace(retPtr[-1]), bVar1) {
      retPtr = retPtr + -1;
    }
    *sign = 1;
    if (*local_40 == L'-') {
      *sign = -1;
      local_40 = local_40 + 1;
      if (local_40 == retPtr) {
        pNVar2 = (NumberFormatException *)__cxa_allocate_exception(0x30);
        NumberFormatException::NumberFormatException
                  (pNVar2,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
                   ,0xed,XMLNUM_Inv_chars,manager);
        __cxa_throw(pNVar2,&NumberFormatException::typeinfo,
                    NumberFormatException::~NumberFormatException);
      }
    }
    else if ((*local_40 == L'+') && (local_40 = local_40 + 1, local_40 == retPtr)) {
      pNVar2 = (NumberFormatException *)__cxa_allocate_exception(0x30);
      NumberFormatException::NumberFormatException
                (pNVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
                 ,0xf5,XMLNUM_Inv_chars,manager);
      __cxa_throw(pNVar2,&NumberFormatException::typeinfo,
                  NumberFormatException::~NumberFormatException);
    }
    for (; *local_40 == L'0'; local_40 = local_40 + 1) {
    }
    if (local_40 < retPtr) {
      bVar1 = false;
      pXStack_60 = retBuffer;
      while (local_40 < retPtr) {
        if (*local_40 == L'.') {
          if (bVar1) {
            pNVar2 = (NumberFormatException *)__cxa_allocate_exception(0x30);
            NumberFormatException::NumberFormatException
                      (pNVar2,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
                       ,0x115,XMLNUM_2ManyDecPoint,manager);
            __cxa_throw(pNVar2,&NumberFormatException::typeinfo,
                        NumberFormatException::~NumberFormatException);
          }
          bVar1 = true;
          *fractDigits = (int)((long)retPtr - (long)local_40 >> 1) + -1;
          local_40 = local_40 + 1;
        }
        else {
          if (((ushort)*local_40 < 0x30) || (0x39 < (ushort)*local_40)) {
            pNVar2 = (NumberFormatException *)__cxa_allocate_exception(0x30);
            NumberFormatException::NumberFormatException
                      (pNVar2,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
                       ,0x11a,XMLNUM_Inv_chars,manager);
            __cxa_throw(pNVar2,&NumberFormatException::typeinfo,
                        NumberFormatException::~NumberFormatException);
          }
          *pXStack_60 = *local_40;
          *totalDigits = *totalDigits + 1;
          pXStack_60 = pXStack_60 + 1;
          local_40 = local_40 + 1;
        }
      }
      while( true ) {
        bVar1 = false;
        if (0 < *fractDigits) {
          bVar1 = pXStack_60[-1] == L'0';
        }
        if (!bVar1) break;
        pXStack_60 = pXStack_60 + -1;
        *fractDigits = *fractDigits + -1;
        *totalDigits = *totalDigits + -1;
      }
      if (*totalDigits == 0) {
        *sign = 0;
      }
      *pXStack_60 = L'\0';
    }
    else {
      *sign = 0;
    }
    return;
  }
  pNVar2 = (NumberFormatException *)__cxa_allocate_exception(0x30);
  NumberFormatException::NumberFormatException
            (pNVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
             ,0xdd,XMLNUM_WSString,manager);
  __cxa_throw(pNVar2,&NumberFormatException::typeinfo,NumberFormatException::~NumberFormatException)
  ;
}

Assistant:

void  XMLBigDecimal::parseDecimal(const XMLCh* const toParse
                               ,        XMLCh* const retBuffer
                               ,        int&         sign
                               ,        int&         totalDigits
                               ,        int&         fractDigits
                               ,        MemoryManager* const manager)
{
    //init
    retBuffer[0] = chNull;
    totalDigits = 0;
    fractDigits = 0;

    // Strip leading white space, if any. 
    const XMLCh* startPtr = toParse;
    while (XMLChar1_0::isWhitespace(*startPtr))
        startPtr++;

    // If we hit the end, then return failure
    if (!*startPtr)
        ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_WSString, manager);

    // Strip tailing white space, if any.
    const XMLCh* endPtr = toParse + XMLString::stringLen(toParse);
    while (XMLChar1_0::isWhitespace(*(endPtr - 1)))
        endPtr--;

    // '+' or '-' is allowed only at the first position
    // and is NOT included in the return parsed string
    sign = 1;
    if (*startPtr == chDash)
    {
        sign = -1;
        startPtr++;
        if (startPtr == endPtr)
        {
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);
        }
    }
    else if (*startPtr == chPlus)
    {
        startPtr++;         
        if (startPtr == endPtr)
        {
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);
        }
    }

    // Strip leading zeros
    while (*startPtr == chDigit_0)
        startPtr++;

    // containning zero, only zero, nothing but zero
    // it is a zero, indeed
    if (startPtr >= endPtr)
    {
        sign = 0;
        return;
    }

    XMLCh* retPtr = (XMLCh*) retBuffer;

    // Scan data
    bool   dotSignFound = false;
    while (startPtr < endPtr)
    {
        if (*startPtr == chPeriod)
        {
            if (!dotSignFound)
            {
                dotSignFound = true;
                fractDigits = (int)(endPtr - startPtr - 1);
                startPtr++;
                continue;
            }
            else  // '.' is allowed only once
                ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_2ManyDecPoint, manager);
        }

        // If not valid decimal digit, then an error
        if ((*startPtr < chDigit_0) || (*startPtr > chDigit_9))
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);

        // copy over
        *retPtr++ = *startPtr++;
        totalDigits++;
    }

    /***
    E2-44 totalDigits

     ... by restricting it to numbers that are expressible as i x 10^-n
     where i and n are integers such that |i| < 10^totalDigits and 0 <= n <= totalDigits. 

        normalization: remove all trailing zero after the '.'
                       and adjust the scaleValue as well.
    ***/
    while ((fractDigits > 0) && (*(retPtr-1) == chDigit_0))          
    {
        retPtr--;
        fractDigits--;
        totalDigits--;
    }
    // 0.0 got past the check for zero because of the decimal point, so we need to double check it here
    if(totalDigits==0)
        sign = 0;

    *retPtr = chNull;   //terminated
    return;
}